

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O0

bool __thiscall wallet::CWalletTx::IsEquivalentTo(CWalletTx *this,CWalletTx *_tx)

{
  bool bVar1;
  byte bVar2;
  CTransaction *in_RSI;
  long in_FS_OFFSET;
  CTxIn *txin_1;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1_1;
  CTxIn *txin;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1;
  iterator __end1_1;
  iterator __begin1_1;
  iterator __end1;
  iterator __begin1;
  CMutableTransaction tx2;
  CMutableTransaction tx1;
  CTransaction *in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  CTransaction *in_stack_fffffffffffffde8;
  CTransaction *in_stack_fffffffffffffe00;
  CMutableTransaction *in_stack_fffffffffffffe08;
  CMutableTransaction *in_stack_fffffffffffffe10;
  undefined1 local_48 [32];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffde8);
  CMutableTransaction::CMutableTransaction(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffde8);
  CMutableTransaction::CMutableTransaction(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::end
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  while( true ) {
    bVar1 = __gnu_cxx::operator==<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                      ((__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                       in_stack_fffffffffffffde8,
                       (__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                       CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::operator*
              ((__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
               in_stack_fffffffffffffdd8);
    memset(local_28,0,0x20);
    CScript::CScript((CScript *)in_stack_fffffffffffffdd8);
    CScript::operator=((CScript *)in_stack_fffffffffffffde8,
                       (CScript *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
    CScript::~CScript((CScript *)in_stack_fffffffffffffdd8);
    __gnu_cxx::__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::operator++
              ((__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
               in_stack_fffffffffffffdd8);
  }
  std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::end
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  while( true ) {
    bVar1 = __gnu_cxx::operator==<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                      ((__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                       in_stack_fffffffffffffde8,
                       (__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                       CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_fffffffffffffde8 =
         (CTransaction *)
         __gnu_cxx::__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
         operator*((__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                   in_stack_fffffffffffffdd8);
    memset(local_48,0,0x20);
    CScript::CScript((CScript *)in_stack_fffffffffffffdd8);
    CScript::operator=((CScript *)in_stack_fffffffffffffde8,
                       (CScript *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
    CScript::~CScript((CScript *)in_stack_fffffffffffffdd8);
    __gnu_cxx::__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::operator++
              ((__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
               in_stack_fffffffffffffdd8);
  }
  CTransaction::CTransaction(in_RSI,in_stack_fffffffffffffe10);
  CTransaction::CTransaction(in_RSI,in_stack_fffffffffffffe10);
  bVar2 = ::operator==(in_stack_fffffffffffffde8,
                       (CTransaction *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0)
                      );
  CTransaction::~CTransaction(in_stack_fffffffffffffdd8);
  CTransaction::~CTransaction(in_stack_fffffffffffffdd8);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffffdd8);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffffdd8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool CWalletTx::IsEquivalentTo(const CWalletTx& _tx) const
{
        CMutableTransaction tx1 {*this->tx};
        CMutableTransaction tx2 {*_tx.tx};
        for (auto& txin : tx1.vin) txin.scriptSig = CScript();
        for (auto& txin : tx2.vin) txin.scriptSig = CScript();
        return CTransaction(tx1) == CTransaction(tx2);
}